

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O0

void tb_invalidate_phys_page_range_arm
               (uc_struct_conflict1 *uc,tb_page_addr_t start,tb_page_addr_t end)

{
  PageDesc *p_00;
  page_collection *pages_00;
  PageDesc *p;
  page_collection *pages;
  tb_page_addr_t end_local;
  tb_page_addr_t start_local;
  uc_struct_conflict1 *uc_local;
  
  p_00 = page_find(uc,start >> ((byte)uc->init_target_page->bits & 0x3f));
  if (p_00 != (PageDesc *)0x0) {
    pages_00 = page_collection_lock_arm(uc,start,end);
    tb_invalidate_phys_page_range__locked(uc,pages_00,p_00,start,end,0);
    page_collection_unlock_arm(pages_00);
  }
  return;
}

Assistant:

void tb_invalidate_phys_page_range(struct uc_struct *uc, tb_page_addr_t start, tb_page_addr_t end)
{
    struct page_collection *pages;
    PageDesc *p;

    assert_memory_lock();

    p = page_find(uc, start >> TARGET_PAGE_BITS);
    if (p == NULL) {
        return;
    }
    pages = page_collection_lock(uc, start, end);
    tb_invalidate_phys_page_range__locked(uc, pages, p, start, end, 0);
    page_collection_unlock(pages);
}